

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O1

void kill_dead(dill_stream c,basic_block_conflict bb,virtual_insn *insns,int loc)

{
  virtual_insn *insn;
  bool bVar1;
  uint vreg;
  uint uVar2;
  long lVar3;
  virtual_insn *insn_00;
  int used_vregs [3];
  uint local_3c;
  uint local_38;
  uint local_34;
  
  insn = insns + loc;
  vreg = insn_defines(insn);
  if (insn->class_code != '\x14') {
    if ((99 < (int)vreg) && (c->p->vregs[(ulong)vreg - 100].use_info.use_count == 0)) {
      insn->class_code = '\x18';
      set_unused(c,bb,vreg);
    }
    lVar3 = (long)(loc + 1);
    if (lVar3 <= bb->end) {
      insn_00 = insns + lVar3;
      bVar1 = false;
      do {
        insn_uses(insn_00,(int *)&local_3c);
        if (((vreg == local_3c) || (vreg == local_38)) || (vreg == local_34)) {
LAB_00112b64:
          bVar1 = true;
        }
        else {
          uVar2 = insn_defines(insn_00);
          if (uVar2 == vreg) {
            insn->class_code = '\x18';
            goto LAB_00112b64;
          }
        }
        if (bb->end <= lVar3) {
          return;
        }
        lVar3 = lVar3 + 1;
        insn_00 = insn_00 + 1;
      } while (!bVar1);
    }
  }
  return;
}

Assistant:

static void
kill_dead(dill_stream c, basic_block bb, virtual_insn* insns, int loc)
{
    virtual_insn* root_insn = &((virtual_insn*)insns)[loc];
    int def_vreg = insn_defines(root_insn);
    int k;
    int stop = 0;
    if (root_insn->class_code == iclass_call)
        return;
    if (def_vreg >= 100) {
        if (c->p->vregs[def_vreg - 100].use_info.use_count == 0) {
            root_insn->class_code = iclass_nop;
            set_unused(c, bb, def_vreg);
        }
    }
    for (k = loc + 1; ((k <= bb->end) && (!stop)); k++) {
        virtual_insn* ip = &((virtual_insn*)insns)[k];
        int used_vregs[3];
        insn_uses(ip, &used_vregs[0]);
        if ((def_vreg == used_vregs[0]) || (def_vreg == used_vregs[1]) ||
            (def_vreg == used_vregs[2])) {
            stop++;
        } else {
            if (insn_defines(ip) == def_vreg) {
                /* got another define before a use, kill the first */
                root_insn->class_code = iclass_nop;
                stop++;
            }
        }
    }
}